

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cc
# Opt level: O0

int realmain(int argc,char **argv)

{
  int iVar1;
  QPDFUsage *e;
  exception *e_1;
  QPDFJob local_28 [8];
  QPDFJob j;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  QUtil::setLineBuf(_stdout);
  QPDFJob::QPDFJob(local_28);
  QPDFJob::initializeFromArgv((char **)local_28,(char *)argv);
  QPDFJob::run();
  iVar1 = QPDFJob::getExitCode();
  QPDFJob::~QPDFJob(local_28);
  return iVar1;
}

Assistant:

int
realmain(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);
    QUtil::setLineBuf(stdout);

    QPDFJob j;
    try {
        // See "HOW TO ADD A COMMAND-LINE ARGUMENT" in README-maintainer.
        j.initializeFromArgv(argv);
        j.run();
    } catch (QPDFUsage& e) {
        usageExit(e.what());
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        return QPDFJob::EXIT_ERROR;
    }
    return j.getExitCode();
}